

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

void * crn_decompress_crn_to_dds(void *pCRN_file_data,crn_uint32 *file_size)

{
  bool bVar1;
  uint64 uVar2;
  undefined4 *in_RSI;
  data_stream_serializer serializer;
  dynamic_stream dds_file_data;
  mipmapped_texture tex;
  char *in_stack_00000120;
  uint in_stack_0000012c;
  void *in_stack_00000130;
  mipmapped_texture *in_stack_00000138;
  data_stream_serializer *in_stack_00000180;
  mipmapped_texture *in_stack_00000188;
  dynamic_stream *in_stack_ffffffffffffff18;
  mipmapped_texture *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  data_stream_serializer local_b8;
  dynamic_stream local_a8;
  undefined4 local_70;
  undefined4 *local_18;
  void *local_8;
  
  local_18 = in_RSI;
  crnlib::mipmapped_texture::mipmapped_texture
            ((mipmapped_texture *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  bVar1 = crnlib::mipmapped_texture::read_crn_from_memory
                    (in_stack_00000138,in_stack_00000130,in_stack_0000012c,in_stack_00000120);
  if (bVar1) {
    *local_18 = 0;
    crnlib::dynamic_stream::dynamic_stream
              ((dynamic_stream *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    crnlib::dynamic_stream::reserve
              ((dynamic_stream *)in_stack_ffffffffffffff20,
               (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    crnlib::data_stream_serializer::data_stream_serializer(&local_b8,&local_a8.super_data_stream);
    bVar1 = crnlib::mipmapped_texture::write_dds(in_stack_00000188,in_stack_00000180);
    if (bVar1) {
      crnlib::dynamic_stream::reserve
                ((dynamic_stream *)in_stack_ffffffffffffff20,
                 (uint)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      uVar2 = crnlib::dynamic_stream::get_size(in_stack_ffffffffffffff18);
      *local_18 = (int)uVar2;
      in_stack_ffffffffffffff20 = (mipmapped_texture *)crnlib::dynamic_stream::get_buf(&local_a8);
      local_8 = crnlib::vector<unsigned_char>::assume_ownership
                          ((vector<unsigned_char> *)in_stack_ffffffffffffff20);
    }
    else {
      local_8 = (void *)0x0;
    }
    local_70 = 1;
    crnlib::dynamic_stream::~dynamic_stream((dynamic_stream *)in_stack_ffffffffffffff20);
  }
  else {
    *local_18 = 0;
    local_8 = (void *)0x0;
    local_70 = 1;
  }
  crnlib::mipmapped_texture::~mipmapped_texture(in_stack_ffffffffffffff20);
  return local_8;
}

Assistant:

void* crn_decompress_crn_to_dds(const void* pCRN_file_data, crn_uint32& file_size) {
  mipmapped_texture tex;
  if (!tex.read_crn_from_memory(pCRN_file_data, file_size, "from_memory.crn")) {
    file_size = 0;
    return NULL;
  }

  file_size = 0;

  dynamic_stream dds_file_data;
  dds_file_data.reserve(128 * 1024);
  data_stream_serializer serializer(dds_file_data);
  if (!tex.write_dds(serializer))
    return NULL;
  dds_file_data.reserve(0);

  file_size = static_cast<crn_uint32>(dds_file_data.get_size());
  return dds_file_data.get_buf().assume_ownership();
}